

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void __thiscall
boomphf::bfile_iterator<unsigned_long>::bfile_iterator
          (bfile_iterator<unsigned_long> *this,bfile_iterator<unsigned_long> *cr)

{
  int iVar1;
  unsigned_long *__dest;
  size_t __size;
  
  iVar1 = cr->_buffsize;
  this->_buffsize = iVar1;
  this->_pos = cr->_pos;
  this->_is = cr->_is;
  __size = (long)iVar1 << 3;
  __dest = (unsigned_long *)malloc(__size);
  this->_buffer = __dest;
  memcpy(__dest,cr->_buffer,__size);
  iVar1 = cr->_cptread;
  this->_inbuff = cr->_inbuff;
  this->_cptread = iVar1;
  this->_elem = cr->_elem;
  return;
}

Assistant:

bfile_iterator(const bfile_iterator& cr)
		{
			_buffsize = cr._buffsize;
			_pos = cr._pos;
			_is = cr._is;
			_buffer = (basetype *) malloc(_buffsize*sizeof(basetype));
			 memcpy(_buffer,cr._buffer,_buffsize*sizeof(basetype) );
			_inbuff = cr._inbuff;
			_cptread = cr._cptread;
			_elem = cr._elem;
		}